

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

uint64_t mpack_expect_u64(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  mpack_tag_t mVar2;
  
  mVar2 = mpack_read_tag(reader);
  aVar1 = mVar2.v;
  if ((mVar2.type != mpack_type_uint) && (mVar2.type != mpack_type_int || aVar1.i < 0)) {
    mpack_reader_flag_error(reader,mpack_error_type);
    aVar1.u = 0;
  }
  return aVar1.u;
}

Assistant:

uint64_t mpack_expect_u64(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint) {
        return var.v.u;
    } else if (var.type == mpack_type_int) {
        if (var.v.i >= 0)
            return (uint64_t)var.v.i;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}